

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::setRootModelIndex(QComboBox *this,QModelIndex *index)

{
  QPersistentModelIndexData *pQVar1;
  char cVar2;
  QAbstractItemView *pQVar3;
  QPersistentModelIndex *pQVar4;
  long in_FS_OFFSET;
  QPersistentModelIndex local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QPersistentModelIndex *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2c0);
  cVar2 = ::comparesEqual(pQVar4,index);
  if (cVar2 == '\0') {
    QPersistentModelIndex::QPersistentModelIndex(&local_30,index);
    pQVar1 = pQVar4->d;
    pQVar4->d = local_30.d;
    local_30.d = pQVar1;
    QPersistentModelIndex::~QPersistentModelIndex(&local_30);
    pQVar3 = view(this);
    (**(code **)(*(long *)&(pQVar3->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x218))
              (pQVar3,index);
    QWidget::update(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setRootModelIndex(const QModelIndex &index)
{
    Q_D(QComboBox);
    if (d->root == index)
        return;
    d->root = QPersistentModelIndex(index);
    view()->setRootIndex(index);
    update();
}